

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uenum.cpp
# Opt level: O3

char * uenum_nextDefault_63(UEnumeration *en,int32_t *resultLength,UErrorCode *status)

{
  UChar *us;
  char *cs;
  
  if (en->uNext == (UEnumUNext *)0x0) {
    *status = U_UNSUPPORTED_ERROR;
  }
  else {
    us = (*en->uNext)(en,resultLength,status);
    if (us != (UChar *)0x0) {
      cs = (char *)_getBuffer(en,*resultLength + 1);
      if (cs != (char *)0x0) {
        u_UCharsToChars_63(us,cs,*resultLength + 1);
        return cs;
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char* U_EXPORT2
uenum_nextDefault(UEnumeration* en,
            int32_t* resultLength,
            UErrorCode* status)
{
    if (en->uNext != NULL) {
        char *tempCharVal;
        const UChar *tempUCharVal = en->uNext(en, resultLength, status);
        if (tempUCharVal == NULL) {
            return NULL;
        }
        tempCharVal = (char*)
            _getBuffer(en, (*resultLength+1) * sizeof(char));
        if (!tempCharVal) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }
        u_UCharsToChars(tempUCharVal, tempCharVal, *resultLength + 1);
        return tempCharVal;
    } else {
        *status = U_UNSUPPORTED_ERROR;
        return NULL;
    }
}